

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cell.c
# Opt level: O0

REF_STATUS ref_cell_orient_node0(REF_INT nnode,REF_INT node0,REF_INT *nodes)

{
  REF_INT RVar1;
  REF_STATUS ref_private_macro_code_rss;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  REF_INT temp;
  REF_INT *nodes_local;
  REF_INT node0_local;
  REF_INT nnode_local;
  
  if ((long)nnode == 4) {
    if (node0 == *nodes) {
      node0_local = 0;
    }
    else if (node0 == nodes[1]) {
      RVar1 = *nodes;
      *nodes = nodes[1];
      nodes[1] = RVar1;
      RVar1 = nodes[2];
      nodes[2] = nodes[3];
      nodes[3] = RVar1;
      node0_local = 0;
    }
    else if (node0 == nodes[2]) {
      RVar1 = *nodes;
      *nodes = nodes[2];
      nodes[2] = RVar1;
      RVar1 = nodes[3];
      nodes[3] = nodes[1];
      nodes[1] = RVar1;
      node0_local = 0;
    }
    else if (node0 == nodes[3]) {
      RVar1 = *nodes;
      *nodes = nodes[3];
      nodes[3] = RVar1;
      RVar1 = nodes[2];
      nodes[2] = nodes[1];
      nodes[1] = RVar1;
      node0_local = 0;
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",0x3f9,
             "ref_cell_orient_node0",5,"node0 not found in nodes");
      node0_local = 5;
    }
  }
  else {
    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",0x3db,
           "ref_cell_orient_node0","only implemented for tets",4,(long)nnode);
    node0_local = 1;
  }
  return node0_local;
}

Assistant:

REF_FCN REF_STATUS ref_cell_orient_node0(REF_INT nnode, REF_INT node0,
                                         REF_INT *nodes) {
  REF_INT temp;
  REIS(4, nnode, "only implemented for tets");
  if (node0 == nodes[0]) return REF_SUCCESS;
  if (node0 == nodes[1]) {
    temp = nodes[0];
    nodes[0] = nodes[1];
    nodes[1] = temp;
    temp = nodes[2];
    nodes[2] = nodes[3];
    nodes[3] = temp;
    return REF_SUCCESS;
  }
  if (node0 == nodes[2]) {
    temp = nodes[0];
    nodes[0] = nodes[2];
    nodes[2] = temp;
    temp = nodes[3];
    nodes[3] = nodes[1];
    nodes[1] = temp;
    return REF_SUCCESS;
  }
  if (node0 == nodes[3]) {
    temp = nodes[0];
    nodes[0] = nodes[3];
    nodes[3] = temp;
    temp = nodes[2];
    nodes[2] = nodes[1];
    nodes[1] = temp;
    return REF_SUCCESS;
  }

  RSS(REF_NOT_FOUND, "node0 not found in nodes");
  return REF_SUCCESS;
}